

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

void __thiscall
xLearn::Loss::Initialize
          (Loss *this,Score *score,ThreadPool *pool,bool norm,bool lock_free,index_t batch_size)

{
  ostream *poVar1;
  size_t sVar2;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  Logger *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  int line;
  string *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  LogSeverity severity;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  Logger local_24;
  undefined4 local_20;
  byte local_1a;
  byte local_19;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  if (in_RSI == 0) {
    Logger::Logger(&local_24,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Initialize",&local_81);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffe58,line,in_stack_fffffffffffffe48);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x52);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"score");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger(in_stack_fffffffffffffde0);
    abort();
  }
  if (in_RDX != 0) {
    *(long *)(in_RDI + 8) = in_RSI;
    *(long *)(in_RDI + 0x18) = in_RDX;
    *(byte *)(in_RDI + 0x10) = local_19;
    local_20 = in_R9D;
    sVar2 = ThreadPool::ThreadNumber((ThreadPool *)0x18c078);
    *(size_t *)(in_RDI + 0x20) = sVar2;
    *(byte *)(in_RDI + 0x11) = local_1a & 1;
    *(undefined4 *)(in_RDI + 0x30) = local_20;
    return;
  }
  Logger::Logger(&local_88,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"Initialize",&local_d1);
  poVar1 = Logger::Start(severity,in_stack_fffffffffffffe58,line,in_stack_fffffffffffffe48);
  poVar1 = std::operator<<(poVar1,"CHECK failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x53);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"pool");
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Logger::~Logger(in_stack_fffffffffffffde0);
  abort();
}

Assistant:

void Initialize(Score* score, 
                  ThreadPool* pool, 
                  bool norm = true,
                  bool lock_free = false,
                  index_t batch_size = 0) {
    CHECK_NOTNULL(score);
    CHECK_NOTNULL(pool);
    CHECK_GE(batch_size, 0);
    score_func_ = score;
    pool_ = pool;
    norm_ = norm;
    threadNumber_ = pool_->ThreadNumber();
    lock_free_ = lock_free;
    batch_size_ = batch_size;
  }